

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_CCtx_params params)

{
  U32 *pUVar1;
  void *__dest;
  undefined8 uVar2;
  size_t err_code;
  void *pvVar3;
  U32 *pUVar4;
  size_t sVar5;
  
  uVar2 = params.cParams._8_8_;
  (cdict->matchState).cParams.searchLog = (int)params.cParams._12_8_;
  (cdict->matchState).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
  (cdict->matchState).cParams.targetLength = params.cParams.targetLength;
  (cdict->matchState).cParams.strategy = params.cParams.strategy;
  (cdict->matchState).cParams.windowLog = params.cParams.windowLog;
  (cdict->matchState).cParams.chainLog = params.cParams.chainLog;
  (cdict->matchState).cParams.hashLog = (int)uVar2;
  (cdict->matchState).cParams.searchLog = (int)((ulong)uVar2 >> 0x20);
  (cdict->matchState).dedicatedDictSearch = params.enableDedicatedDictSearch;
  if (((dictSize == 0) || (dictBuffer == (void *)0x0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    cdict->dictContent = dictBuffer;
  }
  else {
    if ((cdict->workspace).phase != ZSTD_cwksp_alloc_objects) {
LAB_01247eca:
      (cdict->workspace).allocFailed = '\x01';
      return 0xffffffffffffffc0;
    }
    __dest = (cdict->workspace).objectEnd;
    pvVar3 = (void *)((dictSize + 7 & 0xfffffffffffffff8) + (long)__dest);
    if ((cdict->workspace).workspaceEnd < pvVar3) goto LAB_01247eca;
    (cdict->workspace).objectEnd = pvVar3;
    (cdict->workspace).tableEnd = pvVar3;
    (cdict->workspace).tableValidEnd = pvVar3;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    cdict->dictContent = __dest;
    switchD_00b041bd::default(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  cdict->dictContentType = dictContentType;
  if ((cdict->workspace).phase == ZSTD_cwksp_alloc_objects) {
    pUVar4 = (U32 *)(cdict->workspace).objectEnd;
    pUVar1 = pUVar4 + 0x880;
    if (pUVar1 <= (cdict->workspace).workspaceEnd) {
      (cdict->workspace).objectEnd = pUVar1;
      (cdict->workspace).tableEnd = pUVar1;
      (cdict->workspace).tableValidEnd = pUVar1;
      goto LAB_01247f18;
    }
  }
  (cdict->workspace).allocFailed = '\x01';
  pUVar4 = (U32 *)0x0;
LAB_01247f18:
  cdict->entropyWorkspace = pUVar4;
  (cdict->cBlockState).rep[0] = 1;
  (cdict->cBlockState).rep[1] = 4;
  (cdict->cBlockState).rep[2] = 8;
  (cdict->cBlockState).entropy.huf.repeatMode = HUF_repeat_none;
  (cdict->cBlockState).entropy.fse.offcode_repeatMode = FSE_repeat_none;
  (cdict->cBlockState).entropy.fse.matchlength_repeatMode = FSE_repeat_none;
  (cdict->cBlockState).entropy.fse.litlength_repeatMode = FSE_repeat_none;
  sVar5 = ZSTD_reset_matchState
                    (&cdict->matchState,&cdict->workspace,&params.cParams,params.useRowMatchFinder,
                     ZSTDcrp_makeClean,ZSTDirp_reset,ZSTD_resetTarget_CDict);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  params.compressionLevel = 3;
  params.fParams.contentSizeFlag = 1;
  sVar5 = ZSTD_compress_insertDictionary
                    (&cdict->cBlockState,&cdict->matchState,(ldmState_t *)0x0,&cdict->workspace,
                     &params,cdict->dictContent,cdict->dictContentSize,dictContentType,
                     ZSTD_dtlm_full,ZSTD_tfp_forCDict,cdict->entropyWorkspace);
  if (sVar5 < 0xffffffffffffff89) {
    cdict->dictID = (U32)sVar5;
    return 0;
  }
  return sVar5;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_CCtx_params params)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(params.cParams));
    cdict->matchState.cParams = params.cParams;
    cdict->matchState.dedicatedDictSearch = params.enableDedicatedDictSearch;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation, "NULL pointer!");
        cdict->dictContent = internalBuffer;
        ZSTD_memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;
    cdict->dictContentType = dictContentType;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &params.cParams,
        params.useRowMatchFinder,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict), "");
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, ZSTD_tfp_forCDict, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}